

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2Impl::composeAndAppend
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool doCompose,UBool onlyContiguous,
          UnicodeString *safeMiddle,ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  char16_t *src_00;
  UChar *middleStart;
  undefined1 local_88 [8];
  UnicodeString middle;
  int32_t destSuffixLength;
  UChar *lastStarterInDest;
  UChar *firstStarterInSrc;
  UnicodeString *safeMiddle_local;
  UBool onlyContiguous_local;
  UChar *pUStack_20;
  UBool doCompose_local;
  UChar *limit_local;
  UChar *src_local;
  Normalizer2Impl *this_local;
  
  UVar1 = ReorderingBuffer::isEmpty(buffer);
  pUVar3 = src;
  if ((UVar1 == '\0') &&
     (limit_local = findNextCompBoundary(this,src,limit,onlyContiguous), pUVar3 = src,
     src != limit_local)) {
    pUVar3 = ReorderingBuffer::getStart(buffer);
    pUVar4 = ReorderingBuffer::getLimit(buffer);
    pUVar3 = findPreviousCompBoundary(this,pUVar3,pUVar4,onlyContiguous);
    pUVar4 = ReorderingBuffer::getLimit(buffer);
    middle.fUnion._52_4_ = (undefined4)((ulong)((long)pUVar4 - (long)pUVar3) >> 1);
    UnicodeString::UnicodeString((UnicodeString *)local_88,pUVar3,middle.fUnion._52_4_);
    ReorderingBuffer::removeSuffix(buffer,middle.fUnion._52_4_);
    UnicodeString::operator=(safeMiddle,(UnicodeString *)local_88);
    ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&middleStart,src);
    UnicodeString::append
              ((UnicodeString *)local_88,(ConstChar16Ptr *)&middleStart,
               (int32_t)((ulong)((long)limit_local - (long)src) >> 1));
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&middleStart);
    src_00 = UnicodeString::getBuffer((UnicodeString *)local_88);
    iVar2 = UnicodeString::length((UnicodeString *)local_88);
    compose(this,src_00,src_00 + iVar2,onlyContiguous,'\x01',buffer,errorCode);
    UVar1 = ::U_FAILURE(*errorCode);
    if (UVar1 != '\0') {
      limit_local = src;
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_88);
    pUVar3 = limit_local;
    if (UVar1 != '\0') {
      return;
    }
  }
  limit_local = pUVar3;
  if (doCompose == '\0') {
    pUStack_20 = limit;
    if (limit == (UChar *)0x0) {
      pUStack_20 = u_strchr_63(limit_local,L'\0');
    }
    ReorderingBuffer::appendZeroCC(buffer,limit_local,pUStack_20,errorCode);
  }
  else {
    compose(this,limit_local,limit,onlyContiguous,'\x01',buffer,errorCode);
  }
  return;
}

Assistant:

void Normalizer2Impl::composeAndAppend(const UChar *src, const UChar *limit,
                                       UBool doCompose,
                                       UBool onlyContiguous,
                                       UnicodeString &safeMiddle,
                                       ReorderingBuffer &buffer,
                                       UErrorCode &errorCode) const {
    if(!buffer.isEmpty()) {
        const UChar *firstStarterInSrc=findNextCompBoundary(src, limit, onlyContiguous);
        if(src!=firstStarterInSrc) {
            const UChar *lastStarterInDest=findPreviousCompBoundary(buffer.getStart(),
                                                                    buffer.getLimit(), onlyContiguous);
            int32_t destSuffixLength=(int32_t)(buffer.getLimit()-lastStarterInDest);
            UnicodeString middle(lastStarterInDest, destSuffixLength);
            buffer.removeSuffix(destSuffixLength);
            safeMiddle=middle;
            middle.append(src, (int32_t)(firstStarterInSrc-src));
            const UChar *middleStart=middle.getBuffer();
            compose(middleStart, middleStart+middle.length(), onlyContiguous,
                    TRUE, buffer, errorCode);
            if(U_FAILURE(errorCode)) {
                return;
            }
            src=firstStarterInSrc;
        }
    }
    if(doCompose) {
        compose(src, limit, onlyContiguous, TRUE, buffer, errorCode);
    } else {
        if(limit==NULL) {  // appendZeroCC() needs limit!=NULL
            limit=u_strchr(src, 0);
        }
        buffer.appendZeroCC(src, limit, errorCode);
    }
}